

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles2::Functional::anon_unknown_0::verifyUniformValue4i
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,GLint x,
               GLint y,GLint z,GLint w)

{
  bool bVar1;
  qpTestResult qVar2;
  int (*paiVar3) [4];
  TestLog *this;
  MessageBuilder *pMVar4;
  MessageBuilder local_1d8;
  undefined1 local_58 [8];
  StateQueryMemoryWriteGuard<int[4]> state;
  GLint y_local;
  GLint x_local;
  GLint location_local;
  GLuint program_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  state.m_postguard[2] = y;
  state.m_postguard[3] = x;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int[4]> *)local_58);
  paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_58);
  glu::CallLogWrapper::glGetUniformiv(gl,program,location,*paiVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int[4]> *)local_58,testCtx);
  if ((bVar1) &&
     ((((paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58),
        (*paiVar3)[0] != state.m_postguard[3] ||
        (paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58),
        (*paiVar3)[1] != state.m_postguard[2])) ||
       (paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58),
       (*paiVar3)[2] != z)) ||
      (paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58),
      (*paiVar3)[3] != w)))) {
    this = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1d8,this,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [21])"// ERROR: expected [");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,state.m_postguard + 3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xafd70f);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,state.m_postguard + 2);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xafd70f);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&z);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xafd70f);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&w);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [9])"]; got [");
    paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*paiVar3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xafd70f);
    paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*paiVar3 + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xafd70f);
    paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*paiVar3 + 2);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xafd70f);
    paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*paiVar3 + 3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0xacaf61);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue4i (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, GLint x, GLint y, GLint z, GLint w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[4]> state;
	gl.glGetUniformiv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y ||
		state[2] != z ||
		state[3] != w)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y << ", "
		<< z << ", "
		<< w
		<< "]; got ["
		<< state[0] << ", "
		<< state[1] << ", "
		<< state[2] << ", "
		<< state[3]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}